

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::DistanceFinder::find(DistanceFinder *this,SelectionSet *bs,RealType distance,int frame)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *pSVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_type sVar5;
  reference ppSVar6;
  size_t sVar7;
  reference ppMVar8;
  reference ppBVar9;
  Snapshot *pSVar10;
  reference ppBVar11;
  reference ppTVar12;
  reference ppIVar13;
  uint in_ECX;
  undefined8 *in_RSI;
  SelectionSet *in_RDI;
  double in_XMM0_Qa;
  double dVar14;
  Vector3d r_5;
  Vector3d loc_3;
  size_t j_6;
  Vector3d r_4;
  Vector3d loc_2;
  size_t j_5;
  Vector3d r_3;
  Vector3d loc_1;
  size_t j_4;
  Vector3d r_2;
  Vector3d loc;
  size_t j_3;
  Vector3d r_1;
  size_t j_2;
  Vector3d r;
  size_t j_1;
  size_t i;
  SelectionSet bsTemp;
  RigidBody *rb;
  uint j;
  Snapshot *currSnapshot;
  Vector3d centerPos;
  StuntDouble *center;
  SelectionSet *bsResult;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  OpenMDBitSet *in_stack_fffffffffffffb00;
  Atom *in_stack_fffffffffffffb08;
  Atom *in_stack_fffffffffffffb10;
  Atom *in_stack_fffffffffffffb18;
  SelectionSet *in_stack_fffffffffffffb48;
  SelectionSet *in_stack_fffffffffffffb50;
  double in_stack_fffffffffffffb60;
  Molecule *in_stack_fffffffffffffb68;
  Atom *in_stack_fffffffffffffb78;
  Snapshot *in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffc8c;
  RigidBody *in_stack_fffffffffffffc90;
  ulong local_348;
  ulong local_298;
  Snapshot *local_200;
  ulong local_180;
  ulong local_130;
  ulong local_e0;
  size_type local_c0;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_a0;
  value_type local_88;
  uint local_80;
  byte local_51;
  undefined8 local_50;
  value_type local_30;
  uint local_24;
  double local_20;
  
  local_24 = in_ECX;
  local_20 = in_XMM0_Qa;
  Vector3<double>::Vector3((Vector3<double> *)0x42367f);
  pSVar3 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  iVar2 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)local_24);
  local_50 = CONCAT44(extraout_var,iVar2);
  local_51 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb48);
  SelectionSet::SelectionSet
            (in_stack_fffffffffffffb50,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10);
  for (local_80 = 0; uVar4 = (ulong)local_80,
      sVar5 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                        ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                         (in_RSI + 1)), uVar4 < sVar5; local_80 = local_80 + 1) {
    ppSVar6 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator[]
                        ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                         (in_RSI + 1),(ulong)local_80);
    if (*ppSVar6 != (value_type)0x0) {
      ppSVar6 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RSI + 1),(ulong)local_80);
      bVar1 = StuntDouble::isRigidBody(*ppSVar6);
      if (bVar1) {
        ppSVar6 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 1),(ulong)local_80);
        local_88 = *ppSVar6;
        RigidBody::updateAtoms(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      }
    }
  }
  SelectionSet::SelectionSet
            ((SelectionSet *)in_stack_fffffffffffffb00,
             (SelectionSet *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  SelectionSet::parallelReduce(in_stack_fffffffffffffb48);
  SelectionSet::operator=
            ((SelectionSet *)in_stack_fffffffffffffb00,
             (SelectionSet *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  SelectionSet::~SelectionSet((SelectionSet *)0x42387b);
  local_c0 = 0;
  while( true ) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (&local_a0,0);
    sVar7 = OpenMDBitSet::size((OpenMDBitSet *)0x4238b0);
    if (sVar7 <= local_c0) break;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (&local_a0,0);
    bVar1 = OpenMDBitSet::operator[](in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
    if (bVar1) {
      ppSVar6 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RSI + 1),local_c0);
      local_30 = *ppSVar6;
      StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                          (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffb00,
                 (Vector3<double> *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      for (local_e0 = 0;
          sVar5 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::size
                            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                             (in_RSI + 0x10)), local_e0 < sVar5; local_e0 = local_e0 + 1) {
        ppMVar8 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                             (in_RSI + 0x10),local_e0);
        if (*ppMVar8 != (value_type)0x0) {
          std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                    ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                     (in_RSI + 0x10),local_e0);
          Molecule::getCom(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20)
                          );
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Snapshot::wrapVector(in_stack_fffffffffffffb80,(Vector3d *)in_stack_fffffffffffffb78);
          dVar14 = Vector<double,_3U>::length((Vector<double,_3U> *)0x423a5b);
          if (dVar14 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,5);
            OpenMDBitSet::setBitOn
                      (in_stack_fffffffffffffb00,
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          }
        }
      }
      for (local_130 = 0;
          sVar5 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 1)), local_130 < sVar5; local_130 = local_130 + 1) {
        ppSVar6 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 1),local_130);
        if (*ppSVar6 != (value_type)0x0) {
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator[]
                    ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                     (in_RSI + 1),local_130);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Snapshot::wrapVector(in_stack_fffffffffffffb80,(Vector3d *)in_stack_fffffffffffffb78);
          dVar14 = Vector<double,_3U>::length((Vector<double,_3U> *)0x423bd7);
          if (dVar14 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,0);
            OpenMDBitSet::setBitOn
                      (in_stack_fffffffffffffb00,
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          }
        }
      }
      for (local_180 = 0;
          sVar5 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::size
                            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4)
                            ), local_180 < sVar5; local_180 = local_180 + 1) {
        ppBVar9 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4)
                             ,local_180);
        if (*ppBVar9 != (value_type)0x0) {
          std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                    ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4),
                     local_180);
          Bond::getAtomA((Bond *)0x423cc1);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                    ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4),
                     local_180);
          Bond::getAtomB((Bond *)0x423d0a);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                    (double)in_stack_fffffffffffffb00);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb08,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Snapshot::wrapVector(in_stack_fffffffffffffb80,(Vector3d *)in_stack_fffffffffffffb78);
          dVar14 = Vector<double,_3U>::length((Vector<double,_3U> *)0x423dd9);
          if (dVar14 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,1);
            OpenMDBitSet::setBitOn
                      (in_stack_fffffffffffffb00,
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          }
        }
      }
      local_200 = (Snapshot *)0x0;
      while (in_stack_fffffffffffffb80 = local_200,
            pSVar10 = (Snapshot *)
                      std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::size
                                ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
                                 (in_RSI + 7)), in_stack_fffffffffffffb80 < pSVar10) {
        ppBVar11 = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                             ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
                              (in_RSI + 7),(size_type)local_200);
        if (*ppBVar11 != (value_type)0x0) {
          std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                    ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RSI + 7),
                     (size_type)local_200);
          in_stack_fffffffffffffb78 = Bend::getAtomA((Bend *)0x423ec4);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                    ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RSI + 7),
                     (size_type)local_200);
          Bend::getAtomB((Bend *)0x423f0d);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                    ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RSI + 7),
                     (size_type)local_200);
          in_stack_fffffffffffffb68 = (Molecule *)Bend::getAtomC((Bend *)0x423f67);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                    (double)in_stack_fffffffffffffb00);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb08,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Snapshot::wrapVector(in_stack_fffffffffffffb80,(Vector3d *)in_stack_fffffffffffffb78);
          in_stack_fffffffffffffb60 = Vector<double,_3U>::length((Vector<double,_3U> *)0x424030);
          if (in_stack_fffffffffffffb60 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,2);
            OpenMDBitSet::setBitOn
                      (in_stack_fffffffffffffb00,
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          }
        }
        local_200 = (Snapshot *)
                    ((long)&(local_200->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      for (local_298 = 0;
          sVar5 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::size
                            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                             (in_RSI + 10)), local_298 < sVar5; local_298 = local_298 + 1) {
        ppTVar12 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                             ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                              (in_RSI + 10),local_298);
        if (*ppTVar12 != (value_type)0x0) {
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_298);
          Torsion::getAtomA((Torsion *)0x42410f);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_298);
          Torsion::getAtomB((Torsion *)0x424152);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_298);
          Torsion::getAtomC((Torsion *)0x4241ac);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_298);
          Torsion::getAtomD((Torsion *)0x424206);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                    (double)in_stack_fffffffffffffb00);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb08,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Snapshot::wrapVector(in_stack_fffffffffffffb80,(Vector3d *)in_stack_fffffffffffffb78);
          dVar14 = Vector<double,_3U>::length((Vector<double,_3U> *)0x4242cf);
          if (dVar14 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,3);
            OpenMDBitSet::setBitOn
                      (in_stack_fffffffffffffb00,
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          }
        }
      }
      for (local_348 = 0;
          sVar5 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::size
                            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                             (in_RSI + 0xd)), local_348 < sVar5; local_348 = local_348 + 1) {
        ppIVar13 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::
                   operator[]((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                              (in_RSI + 0xd),local_348);
        iVar2 = (int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
        if (*ppIVar13 != (value_type)0x0) {
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_348);
          Inversion::getAtomA((Inversion *)0x4243ae);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,iVar2);
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_348);
          in_stack_fffffffffffffb18 = Inversion::getAtomB((Inversion *)0x4243f1);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,iVar2);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_348);
          in_stack_fffffffffffffb10 = Inversion::getAtomC((Inversion *)0x42444b);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_348);
          in_stack_fffffffffffffb08 = Inversion::getAtomD((Inversion *)0x4244a5);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble,
                              (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                    (double)in_stack_fffffffffffffb00);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb08,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb08,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb00);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb00,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Snapshot::wrapVector(in_stack_fffffffffffffb80,(Vector3d *)in_stack_fffffffffffffb78);
          in_stack_fffffffffffffb00 =
               (OpenMDBitSet *)Vector<double,_3U>::length((Vector<double,_3U> *)0x42456e);
          if ((double)in_stack_fffffffffffffb00 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,4);
            OpenMDBitSet::setBitOn
                      (in_stack_fffffffffffffb00,
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          }
        }
      }
    }
    local_c0 = local_c0 + 1;
  }
  local_51 = 1;
  SelectionSet::~SelectionSet((SelectionSet *)0x424600);
  if ((local_51 & 1) == 0) {
    SelectionSet::~SelectionSet((SelectionSet *)0x424617);
  }
  return in_RDI;
}

Assistant:

SelectionSet DistanceFinder::find(const SelectionSet& bs, RealType distance,
                                    int frame) {
    StuntDouble* center;
    Vector3d centerPos;
    Snapshot* currSnapshot = info_->getSnapshotManager()->getSnapshot(frame);
    SelectionSet bsResult(nObjects_);
    assert(bsResult.size() == bs.size());

#ifdef IS_MPI
    int mol;
    int proc;
    RealType data[3];
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (unsigned int j = 0; j < stuntdoubles_.size(); ++j) {
      if (stuntdoubles_[j] != NULL) {
        if (stuntdoubles_[j]->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(stuntdoubles_[j]);
          rb->updateAtoms(frame);
        }
      }
    }

    SelectionSet bsTemp = bs;
    bsTemp              = bsTemp.parallelReduce();

    for (size_t i = 0; i < bsTemp.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (bsTemp.bitsets_[STUNTDOUBLE][i]) {
        // Now, if we own stuntdouble i, we can use the position, but in
        // parallel, we'll need to let everyone else know what that
        // position is!

#ifdef IS_MPI
        mol  = info_->getGlobalMolMembership(i);
        proc = info_->getMolToProc(mol);

        if (proc == worldRank) {
          center    = stuntdoubles_[i];
          centerPos = center->getPos(frame);
          data[0]   = centerPos.x();
          data[1]   = centerPos.y();
          data[2]   = centerPos.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
          centerPos = Vector3d(data);
        }
#else
        center    = stuntdoubles_[i];
        centerPos = center->getPos(frame);
#endif
        for (size_t j = 0; j < molecules_.size(); ++j) {
          if (molecules_[j] != NULL) {
            Vector3d r = centerPos - molecules_[j]->getCom(frame);
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[MOLECULE].setBitOn(j);
            }
          }
        }

        for (size_t j = 0; j < stuntdoubles_.size(); ++j) {
          if (stuntdoubles_[j] != NULL) {
            Vector3d r = centerPos - stuntdoubles_[j]->getPos(frame);
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[STUNTDOUBLE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < bonds_.size(); ++j) {
          if (bonds_[j] != NULL) {
            Vector3d loc = bonds_[j]->getAtomA()->getPos(frame);
            loc += bonds_[j]->getAtomB()->getPos(frame);
            loc        = loc / 2.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BOND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < bends_.size(); ++j) {
          if (bends_[j] != NULL) {
            Vector3d loc = bends_[j]->getAtomA()->getPos(frame);
            loc += bends_[j]->getAtomB()->getPos(frame);
            loc += bends_[j]->getAtomC()->getPos(frame);
            loc        = loc / 3.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BEND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < torsions_.size(); ++j) {
          if (torsions_[j] != NULL) {
            Vector3d loc = torsions_[j]->getAtomA()->getPos(frame);
            loc += torsions_[j]->getAtomB()->getPos(frame);
            loc += torsions_[j]->getAtomC()->getPos(frame);
            loc += torsions_[j]->getAtomD()->getPos(frame);
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[TORSION].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < inversions_.size(); ++j) {
          if (inversions_[j] != NULL) {
            Vector3d loc = inversions_[j]->getAtomA()->getPos(frame);
            loc += inversions_[j]->getAtomB()->getPos(frame);
            loc += inversions_[j]->getAtomC()->getPos(frame);
            loc += inversions_[j]->getAtomD()->getPos(frame);
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[INVERSION].setBitOn(j);
            }
          }
        }
      }
    }
    return bsResult;
  }